

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_application_info(StateRecorder *this,VkApplicationInfo *info)

{
  void *pvVar1;
  Impl *this_00;
  Hash HVar2;
  mutex *__mutex;
  allocator local_41;
  string local_40;
  
  pvVar1 = info->pNext;
  if (pvVar1 == (void *)0x0) {
    __mutex = &this->impl->record_lock;
    std::mutex::lock(__mutex);
    this_00 = this->impl;
    Impl::copy_application_info(this_00,info,&this_00->allocator,&this_00->application_info);
    HVar2 = Hashing::compute_hash_application_info(this->impl->application_info);
    (this->impl->application_feature_hash).application_info_hash = HVar2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"pNext in VkApplicationInfo not supported.",&local_41);
    log_error_pnext_chain(&local_40,info->pNext);
    std::__cxx11::string::_M_dispose();
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::record_application_info(const VkApplicationInfo &info)
{
	if (info.pNext)
	{
		log_error_pnext_chain("pNext in VkApplicationInfo not supported.", info.pNext);
		return false;
	}

	std::lock_guard<std::mutex> lock(impl->record_lock);
	if (!impl->copy_application_info(&info, impl->allocator, &impl->application_info))
		return false;
	impl->application_feature_hash.application_info_hash = Hashing::compute_hash_application_info(*impl->application_info);
	return true;
}